

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
emplace_back<slang::SmallVector<slang::ast::NetAlias,2ul>>
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *this,
          SmallVector<slang::ast::NetAlias,_2UL> *args)

{
  long lVar1;
  pointer pSVar2;
  
  pSVar2 = (pointer)(*(long *)(this + 8) * 0x58 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    pSVar2 = emplaceRealloc<slang::SmallVector<slang::ast::NetAlias,2ul>>(this,pSVar2,args);
    return pSVar2;
  }
  SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
            (pSVar2,&args->super_SmallVectorBase<slang::ast::NetAlias>);
  lVar1 = *(long *)(this + 8);
  *(long *)(this + 8) = lVar1 + 1;
  return (reference)(lVar1 * 0x58 + *(long *)this);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }